

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtContext.cpp
# Opt level: O2

bool JsrtContext::TrySetCurrent(JsrtContext *context)

{
  ThreadContext *threadContext;
  void *obj;
  bool bVar1;
  long lVar2;
  
  if (context == (JsrtContext *)0x0) {
    bVar1 = ThreadContextTLSEntry::ClearThreadContext(true);
    if (!bVar1) {
      return false;
    }
    lVar2 = __tls_get_addr(&PTR_013e5b90);
  }
  else {
    threadContext =
         ((((context->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
         threadContext;
    bVar1 = ThreadContextTLSEntry::TrySetThreadContext(threadContext);
    if (!bVar1) {
      return false;
    }
    lVar2 = __tls_get_addr(&PTR_013e5b90);
    if (*(JsrtContext **)(lVar2 + 0x48) == context) {
      return true;
    }
    Memory::Recycler::RootAddRef(threadContext->recycler,context,(uint *)0x0);
  }
  obj = *(void **)(lVar2 + 0x48);
  if (obj != (void *)0x0) {
    Memory::Recycler::RootRelease
              (*(Recycler **)(*(long *)(*(long *)((long)obj + 8) + 0x490) + 0x1200),obj,(uint *)0x0)
    ;
  }
  *(JsrtContext **)(lVar2 + 0x48) = context;
  return true;
}

Assistant:

bool JsrtContext::TrySetCurrent(JsrtContext * context)
{
    ThreadContext * threadContext;

    //We are not pinning the context after SetCurrentContext, so if the context is not pinned
    //it might be reclaimed half way during execution. In jsrtshell the runtime was optimized out
    //at time of JsrtContext::Run by the compiler.
    //The change is to pin the context at setconcurrentcontext, and unpin the previous one. In
    //JsDisposeRuntime we'll reject if current context is active, so that will make sure all
    //contexts are unpinned at time of JsDisposeRuntime.
    if (context != nullptr)
    {
        threadContext = context->GetScriptContext()->GetThreadContext();

        if (!ThreadContextTLSEntry::TrySetThreadContext(threadContext))
        {
            return false;
        }
        // no need to rootAddRef and Release for the same context
        if (s_tlvSlot == context) return true;

        threadContext->GetRecycler()->RootAddRef((LPVOID)context);
    }
    else
    {
        if (!ThreadContextTLSEntry::ClearThreadContext(true))
        {
            return false;
        }
    }

    JsrtContext* originalContext = s_tlvSlot;
    if (originalContext != nullptr)
    {
        originalContext->GetScriptContext()->GetRecycler()->RootRelease((LPVOID) originalContext);
    }

    s_tlvSlot = context;
    return true;
}